

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestMemoryAllocator.cpp
# Opt level: O0

void __thiscall GlobalMemoryAccountant::start(GlobalMemoryAccountant *this)

{
  UtestShell *pUVar1;
  TestTerminator *pTVar2;
  AccountingTestMemoryAllocator *pAVar3;
  TestMemoryAllocator *pTVar4;
  GlobalMemoryAccountant *this_local;
  
  if (this->mallocAllocator_ != (AccountingTestMemoryAllocator *)0x0) {
    pUVar1 = UtestShell::getCurrent();
    pTVar2 = UtestShell::getCurrentTestTerminator();
    (*pUVar1->_vptr_UtestShell[0x1a])
              (pUVar1,"Global allocator start called twice!",
               "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/src/CppUTest/TestMemoryAllocator.cpp"
               ,0x2db,pTVar2);
  }
  pAVar3 = (AccountingTestMemoryAllocator *)
           operator_new(0x40,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/src/CppUTest/TestMemoryAllocator.cpp"
                        ,0x2dd);
  pTVar4 = getCurrentMallocAllocator();
  AccountingTestMemoryAllocator::AccountingTestMemoryAllocator(pAVar3,&this->accountant_,pTVar4);
  this->mallocAllocator_ = pAVar3;
  pAVar3 = (AccountingTestMemoryAllocator *)
           operator_new(0x40,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/src/CppUTest/TestMemoryAllocator.cpp"
                        ,0x2de);
  pTVar4 = getCurrentNewAllocator();
  AccountingTestMemoryAllocator::AccountingTestMemoryAllocator(pAVar3,&this->accountant_,pTVar4);
  this->newAllocator_ = pAVar3;
  pAVar3 = (AccountingTestMemoryAllocator *)
           operator_new(0x40,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/src/CppUTest/TestMemoryAllocator.cpp"
                        ,0x2df);
  pTVar4 = getCurrentNewArrayAllocator();
  AccountingTestMemoryAllocator::AccountingTestMemoryAllocator(pAVar3,&this->accountant_,pTVar4);
  this->newArrayAllocator_ = pAVar3;
  pTVar4 = getCurrentMallocAllocator();
  MemoryAccountant::setAllocator(&this->accountant_,pTVar4);
  setCurrentMallocAllocator(&this->mallocAllocator_->super_TestMemoryAllocator);
  setCurrentNewAllocator(&this->newAllocator_->super_TestMemoryAllocator);
  setCurrentNewArrayAllocator(&this->newArrayAllocator_->super_TestMemoryAllocator);
  return;
}

Assistant:

void GlobalMemoryAccountant::start()
{
    if (mallocAllocator_ != NULLPTR)
      FAIL("Global allocator start called twice!");

    mallocAllocator_ = new AccountingTestMemoryAllocator(accountant_, getCurrentMallocAllocator());
    newAllocator_ = new AccountingTestMemoryAllocator(accountant_, getCurrentNewAllocator());
    newArrayAllocator_ = new AccountingTestMemoryAllocator(accountant_, getCurrentNewArrayAllocator());

    accountant_.setAllocator(getCurrentMallocAllocator());

    setCurrentMallocAllocator(mallocAllocator_);
    setCurrentNewAllocator(newAllocator_);
    setCurrentNewArrayAllocator(newArrayAllocator_);
}